

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

bool __thiscall kj::anon_unknown_35::InMemoryDirectory::exists(InMemoryDirectory *this,PathPtr path)

{
  int iVar1;
  size_t sVar2;
  Impl *this_00;
  String *pSVar3;
  Own<const_kj::ReadableDirectory> *pOVar4;
  ReadableDirectory *pRVar5;
  StringPtr name;
  PathPtr PVar6;
  StringPtr local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [8];
  OwnOwn<const_kj::ReadableDirectory> subdir;
  ArrayPtr<const_char> local_58;
  Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> local_48;
  EntryImpl *local_40;
  EntryImpl *entry;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  InMemoryDirectory *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)path.parts.size_;
  this_local = (InMemoryDirectory *)path.parts.ptr;
  lock.ptr = (Impl *)this;
  sVar2 = PathPtr::size((PathPtr *)&this_local);
  if (sVar2 == 0) {
    path_local.parts.size_._7_1_ = 1;
  }
  else {
    sVar2 = PathPtr::size((PathPtr *)&this_local);
    if (sVar2 == 1) {
      MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
                ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry);
      this_00 = Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                          ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
                           &entry);
      pSVar3 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr((StringPtr *)&local_58,pSVar3);
      local_48 = Impl::tryGetEntry(this_00,(StringPtr)local_58);
      local_40 = kj::_::readMaybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_const>
                           (&local_48);
      if (local_40 == (EntryImpl *)0x0) {
        path_local.parts.size_._7_1_ = false;
      }
      else {
        path_local.parts.size_._7_1_ =
             exists(this,(Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry,
                    local_40);
      }
      subdir.value.ptr._0_4_ = 1;
      Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
                ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry);
    }
    else {
      pSVar3 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr(&local_98,pSVar3);
      name.content.size_ = (size_t)local_98.content.ptr;
      name.content.ptr = (char *)this;
      tryGetParent((InMemoryDirectory *)local_88,name);
      kj::_::readMaybe<kj::ReadableDirectory_const>
                ((_ *)local_78,(Maybe<kj::Own<const_kj::ReadableDirectory>_> *)local_88);
      Maybe<kj::Own<const_kj::ReadableDirectory>_>::~Maybe
                ((Maybe<kj::Own<const_kj::ReadableDirectory>_> *)local_88);
      pOVar4 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_78);
      if (pOVar4 == (Own<const_kj::ReadableDirectory> *)0x0) {
        path_local.parts.size_._7_1_ = 0;
      }
      else {
        pOVar4 = kj::_::OwnOwn<const_kj::ReadableDirectory>::operator->
                           ((OwnOwn<const_kj::ReadableDirectory> *)local_78);
        pRVar5 = Own<const_kj::ReadableDirectory>::get(pOVar4);
        sVar2 = PathPtr::size((PathPtr *)&this_local);
        PVar6 = PathPtr::slice((PathPtr *)&this_local,1,sVar2);
        iVar1 = (*(pRVar5->super_FsNode)._vptr_FsNode[8])(pRVar5,PVar6.parts.ptr,PVar6.parts.size_);
        path_local.parts.size_._7_1_ = (byte)iVar1 & 1;
      }
      subdir.value.ptr._0_4_ = 1;
      kj::_::OwnOwn<const_kj::ReadableDirectory>::~OwnOwn
                ((OwnOwn<const_kj::ReadableDirectory> *)local_78);
    }
  }
  return (bool)(path_local.parts.size_._7_1_ & 1);
}

Assistant:

bool exists(PathPtr path) const override {
    if (path.size() == 0) {
      return true;
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_MAYBE(entry, lock->tryGetEntry(path[0])) {
        return exists(lock, *entry);
      } else {
        return false;
      }
    } else {
      KJ_IF_MAYBE(subdir, tryGetParent(path[0])) {
        return subdir->get()->exists(path.slice(1, path.size()));
      } else {
        return false;
      }
    }
  }